

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IArrayBox.cpp
# Opt level: O3

void __thiscall
amrex::IArrayBox::IArrayBox(IArrayBox *this,Box *b,int n,bool alloc,bool shared,Arena *ar)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int local_14;
  
  (this->super_BaseFab<int>).super_DataAllocator.m_arena = ar;
  (this->super_BaseFab<int>)._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712c98;
  (this->super_BaseFab<int>).dptr = (int *)0x0;
  uVar1 = *(undefined8 *)((b->smallend).vect + 2);
  uVar2 = *(undefined8 *)(b->bigend).vect;
  uVar3 = *(undefined8 *)((b->bigend).vect + 2);
  *(undefined8 *)(this->super_BaseFab<int>).domain.smallend.vect = *(undefined8 *)(b->smallend).vect
  ;
  *(undefined8 *)((this->super_BaseFab<int>).domain.smallend.vect + 2) = uVar1;
  *(undefined8 *)(this->super_BaseFab<int>).domain.bigend.vect = uVar2;
  *(undefined8 *)((this->super_BaseFab<int>).domain.bigend.vect + 2) = uVar3;
  (this->super_BaseFab<int>).nvar = n;
  (this->super_BaseFab<int>).truesize = 0;
  (this->super_BaseFab<int>).ptr_owner = false;
  (this->super_BaseFab<int>).shared_memory = shared;
  if (alloc && !shared) {
    BaseFab<int>::define(&this->super_BaseFab<int>);
  }
  (this->super_BaseFab<int>)._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00713f98;
  if ((alloc) && (do_initval == '\x01')) {
    BaseFab<int>::setVal<(amrex::RunOn)1>
              (&this->super_BaseFab<int>,&local_14,&(this->super_BaseFab<int>).domain,(DestComp)0x0,
               (NumComps)(this->super_BaseFab<int>).nvar);
  }
  return;
}

Assistant:

IArrayBox::IArrayBox (const Box& b, int n, bool alloc, bool shared, Arena* ar)
    : BaseFab<int>(b,n,alloc,shared,ar)
{
#ifndef AMREX_USE_GPU
    // For debugging purposes
    if ( alloc && do_initval ) {
        setVal<RunOn::Host>(std::numeric_limits<int>::max());
    }
#endif
}